

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O1

EFontStretch __thiscall FreeTypeFaceWrapper::GetFontStretch(FreeTypeFaceWrapper *this)

{
  EFontStretch EVar1;
  
  if (this->mFormatParticularWrapper != (IFreeTypeFaceExtender *)0x0) {
    EVar1 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[6])();
    if (EVar1 != eFontStretchUknown) {
      return EVar1;
    }
  }
  EVar1 = StretchFromName(this);
  return EVar1;
}

Assistant:

EFontStretch FreeTypeFaceWrapper::GetFontStretch()
{
	if(mFormatParticularWrapper)
	{
		EFontStretch result = mFormatParticularWrapper->GetFontStretch();
		if(eFontStretchUknown == result)
			return StretchFromName();
		else
			return result;
	}
	return StretchFromName();
}